

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_iarchive_impl.cpp
# Opt level: O1

void __thiscall boost::archive::json_iarchive_impl::load_data(json_iarchive_impl *this)

{
  json_archive *this_00;
  primitive_iterator_t *ppVar1;
  char *__nptr;
  bool bVar2;
  Json *this_01;
  reference this_02;
  key_type *pkVar3;
  int *piVar4;
  long lVar5;
  mapped_type *this_03;
  reference pvVar6;
  undefined8 uVar7;
  undefined1 local_90 [8];
  iterator itr;
  int ret;
  undefined1 local_60 [16];
  Json *local_50;
  json_archive *local_48;
  json_iarchive_impl *local_40;
  int local_34;
  
  this_00 = &(this->super_json_archive_interface).archive_;
  local_40 = this;
  json_archive::push_class_repository(this_00);
  local_48 = this_00;
  this_01 = json_archive::get_data_abi_cxx11_(this_00);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::begin((iterator *)local_90,this_01);
  ppVar1 = &itr.m_it.primitive_iterator;
  local_50 = this_01;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::end((iterator *)ppVar1,this_01);
  bVar2 = nlohmann::detail::
          iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==((iterator *)local_90,
                       (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)ppVar1);
  if (!bVar2) {
    local_40 = (json_iarchive_impl *)&(local_40->super_json_archive_interface).class_map_;
    ppVar1 = &itr.m_it.primitive_iterator;
    do {
      this_02 = nlohmann::detail::
                iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                             *)local_90);
      pkVar3 = nlohmann::detail::
               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               ::key((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                      *)local_90);
      __nptr = (pkVar3->_M_dataplus)._M_p;
      piVar4 = __errno_location();
      local_34 = *piVar4;
      *piVar4 = 0;
      lVar5 = strtol(__nptr,(char **)ppVar1,10);
      if ((char *)CONCAT44(itr.m_it.primitive_iterator.m_it._4_4_,
                           (int)itr.m_it.primitive_iterator.m_it) == __nptr) {
        std::__throw_invalid_argument("stoi");
LAB_0013f8ca:
        uVar7 = std::__throw_out_of_range("stoi");
        if (*piVar4 == 0) {
          *piVar4 = local_34;
        }
        _Unwind_Resume(uVar7);
      }
      if (((int)lVar5 != lVar5) || (*piVar4 == 0x22)) goto LAB_0013f8ca;
      if (*piVar4 == 0) {
        *piVar4 = local_34;
      }
      itr.m_it.primitive_iterator.m_it._0_4_ = (int)lVar5;
      this_03 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_boost::archive::ClassInfo>,_std::allocator<std::pair<const_unsigned_int,_boost::archive::ClassInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_boost::archive::ClassInfo>,_std::allocator<std::pair<const_unsigned_int,_boost::archive::ClassInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)local_40,(key_type *)ppVar1);
      pvVar6 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::operator[](this_02,(key_type *)param::ClassNameType_abi_cxx11_);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ppVar1,pvVar6)
      ;
      std::__cxx11::string::operator=((string *)this_03,(string *)ppVar1);
      if ((undefined1 *)
          CONCAT44(itr.m_it.primitive_iterator.m_it._4_4_,(int)itr.m_it.primitive_iterator.m_it) !=
          local_60) {
        operator_delete((undefined1 *)
                        CONCAT44(itr.m_it.primitive_iterator.m_it._4_4_,
                                 (int)itr.m_it.primitive_iterator.m_it));
      }
      pvVar6 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::operator[](this_02,(key_type *)param::TrackingType_abi_cxx11_);
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_int,_0>
                (pvVar6,(int *)ppVar1);
      this_03->track_ = (int)itr.m_it.primitive_iterator.m_it;
      pvVar6 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::operator[](this_02,(key_type *)param::VersionType_abi_cxx11_);
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_int,_0>
                (pvVar6,(int *)ppVar1);
      this_03->version_ = (int)itr.m_it.primitive_iterator.m_it;
      nlohmann::detail::
      iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::operator++((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                    *)local_90);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::end((iterator *)ppVar1,local_50);
      bVar2 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                            *)local_90,
                           (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                            *)ppVar1);
    } while (!bVar2);
  }
  json_archive::pop_data(local_48);
  return;
}

Assistant:

void json_iarchive_impl::load_data()
{
    archive_.push_class_repository();
    Json& data = archive_.get_data();
    for(auto itr = data.begin(); itr != data.end(); itr++)
    {
        auto& value = *itr;
        ClassInfo& dst = class_map_[std::stoi(itr.key())];
        dst.name_ = value[param::ClassNameType];
        dst.track_ = value[param::TrackingType];
        dst.version_ = value[param::VersionType];
    }
    archive_.pop_data();
}